

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights_test.cpp
# Opt level: O1

void __thiscall LightBounds_Basics_Test::~LightBounds_Basics_Test(LightBounds_Basics_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(LightBounds, Basics) {
    LightBounds bounds(Bounds3f(Point3f(0, 0, 0), Point3f(.1, .1, .01)),
                       Vector3f(0, 0, 1), 1.f /* phi */, 0.f /* theta_o: normal spread */,
                       Pi / 2 /* theta_e: falloff given visible normal */,
                       false /* two-sided */);

    // Positive importance for point on the emissive side
    {
        Interaction intr(Point3f(1, 1, 1), 0.f /* time */, (MediumInterface *)nullptr);
        EXPECT_GT(bounds.Importance(intr.p(), intr.n), 0);
    }

    // Zero importance for point on the non-emissive side
    {
        Interaction intr(Point3f(1, 1, -1), 0.f /* time */, (MediumInterface *)nullptr);
        EXPECT_EQ(bounds.Importance(intr.p(), intr.n), 0);
    }

    // Low importance when close to the emitter's plane (since cos theta)
    {
        Interaction intrHigh(Point3f(1, 1, 1), 0.f /* time */,
                             (MediumInterface *)nullptr);
        Float impHigh = bounds.Importance(intrHigh.p(), intrHigh.n);

        Interaction intrLow(Point3f(1, 1, .02), 0.f /* time */,
                            (MediumInterface *)nullptr);
        Float impLow = bounds.Importance(intrLow.p(), intrLow.n);

        EXPECT_LT(impLow / impHigh, .2);
    }
}